

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device__cork_stream__pulse(ma_device *pDevice,ma_device_type deviceType,int cork)

{
  long lVar1;
  ma_result mVar2;
  ma_pa_operation *pOP;
  ma_log_proc p_Var3;
  char *pcVar4;
  ma_context *pmVar5;
  ma_bool32 wasSuccessful;
  int local_2c;
  
  pmVar5 = pDevice->pContext;
  local_2c = 0;
  lVar1 = *(long *)((long)&pDevice->field_23 +
                   (ulong)(deviceType == ma_device_type_capture) * 8 + 0x18);
  if (lVar1 == 0) {
    __assert_fail("pStream != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4d74,
                  "ma_result ma_device__cork_stream__pulse(ma_device *, ma_device_type, int)");
  }
  pOP = (ma_pa_operation *)
        (*(pmVar5->field_21).alsa.snd_pcm_start)
                  (lVar1,(ulong)(uint)cork,ma_pulse_operation_complete_callback,&local_2c);
  if (pOP == (ma_pa_operation *)0x0) {
    mVar2 = (cork == 0) - 0x12f;
    pmVar5 = pDevice->pContext;
    if (pmVar5 == (ma_context *)0x0) {
      return mVar2;
    }
    p_Var3 = pmVar5->logCallback;
    if (p_Var3 == (ma_log_proc)0x0) {
      return mVar2;
    }
    pcVar4 = "[PulseAudio] Failed to cork PulseAudio stream.";
  }
  else {
    mVar2 = ma_wait_for_operation__pulse
                      (pDevice->pContext,
                       (ma_pa_mainloop *)(pDevice->field_23).null_device.deviceThread.pContext,pOP);
    (*(pmVar5->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pOP);
    if (mVar2 == 0) {
      if (local_2c != 0) {
        return 0;
      }
      pmVar5 = pDevice->pContext;
      if (cork == 0) {
        mVar2 = -0x12e;
        if (pmVar5 == (ma_context *)0x0) {
          return -0x12e;
        }
        p_Var3 = pmVar5->logCallback;
        if (p_Var3 == (ma_log_proc)0x0) {
          return -0x12e;
        }
        pcVar4 = "[PulseAudio] Failed to start PulseAudio stream.";
      }
      else {
        mVar2 = -0x12f;
        if (pmVar5 == (ma_context *)0x0) {
          return -0x12f;
        }
        p_Var3 = pmVar5->logCallback;
        if (p_Var3 == (ma_log_proc)0x0) {
          return -0x12f;
        }
        pcVar4 = "[PulseAudio] Failed to stop PulseAudio stream.";
      }
    }
    else {
      pmVar5 = pDevice->pContext;
      if (pmVar5 == (ma_context *)0x0) {
        return mVar2;
      }
      p_Var3 = pmVar5->logCallback;
      if (p_Var3 == (ma_log_proc)0x0) {
        return mVar2;
      }
      pcVar4 = "[PulseAudio] An error occurred while waiting for the PulseAudio stream to cork.";
    }
  }
  (*p_Var3)(pmVar5,pDevice,1,pcVar4);
  return mVar2;
}

Assistant:

static ma_result ma_device__cork_stream__pulse(ma_device* pDevice, ma_device_type deviceType, int cork)
{
    ma_context* pContext = pDevice->pContext;
    ma_bool32 wasSuccessful;
    ma_pa_stream* pStream;
    ma_pa_operation* pOP;
    ma_result result;

    /* This should not be called with a duplex device type. */
    if (deviceType == ma_device_type_duplex) {
        return MA_INVALID_ARGS;
    }

    wasSuccessful = MA_FALSE;

    pStream = (ma_pa_stream*)((deviceType == ma_device_type_capture) ? pDevice->pulse.pStreamCapture : pDevice->pulse.pStreamPlayback);
    MA_ASSERT(pStream != NULL);

    pOP = ((ma_pa_stream_cork_proc)pContext->pulse.pa_stream_cork)(pStream, cork, ma_pulse_operation_complete_callback, &wasSuccessful);
    if (pOP == NULL) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to cork PulseAudio stream.", (cork == 0) ? MA_FAILED_TO_START_BACKEND_DEVICE : MA_FAILED_TO_STOP_BACKEND_DEVICE);
    }

    result = ma_device__wait_for_operation__pulse(pDevice, pOP);
    ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);

    if (result != MA_SUCCESS) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] An error occurred while waiting for the PulseAudio stream to cork.", result);
    }

    if (!wasSuccessful) {
        if (cork) {
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to stop PulseAudio stream.", MA_FAILED_TO_STOP_BACKEND_DEVICE);
        } else {
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to start PulseAudio stream.", MA_FAILED_TO_START_BACKEND_DEVICE);
        }
    }

    return MA_SUCCESS;
}